

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::Utils::prepareTexture
               (Context *context,GLuint name,GLenum target,GLenum internal_format,GLenum format,
               GLenum type,GLuint level,GLuint width,GLuint height,GLuint depth,GLvoid *pixels,
               GLuint *out_buf_id)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  undefined8 in_stack_fffffffffffffcb0;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffcb8;
  undefined4 uVar8;
  Enum<int,_2UL> local_260;
  char *local_250;
  GetNameFunc local_248;
  int local_240;
  Enum<int,_2UL> local_238;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  MessageBuilder local_1e8;
  GLvoid *local_58;
  GLvoid *data;
  long lStack_48;
  GLsizei size;
  Functions *gl;
  GLchar *function_name;
  GLenum error;
  GLenum type_local;
  GLenum format_local;
  GLenum internal_format_local;
  GLenum target_local;
  GLuint name_local;
  Context *context_local;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
  function_name._0_4_ = 0;
  gl = (Functions *)anon_var_dwarf_6f048;
  function_name._4_4_ = type;
  error = format;
  type_local = internal_format;
  format_local = target;
  internal_format_local = name;
  _target_local = context;
  pRVar3 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_48 = CONCAT44(extraout_var,iVar1);
  format_local = transProxyToRealTarget(format_local);
  if (format_local == 0xde0) {
    (**(code **)(lStack_48 + 0xb8))(0xde0,internal_format_local);
    dVar2 = (**(code **)(lStack_48 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x61b);
    (**(code **)(lStack_48 + 0x1308))
              (format_local,level,type_local,width,0,error,function_name._4_4_,pixels);
    function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
    gl = (Functions *)0x2c7bd8f;
    goto LAB_00e52751;
  }
  if (format_local != 0xde1) {
    if (format_local == 0x806f) {
LAB_00e52340:
      (**(code **)(lStack_48 + 0xb8))(format_local,internal_format_local);
      dVar2 = (**(code **)(lStack_48 + 0x800))();
      glu::checkError(dVar2,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x64a);
      (**(code **)(lStack_48 + 0x1320))
                (format_local,level,type_local,width,height,depth,0,CONCAT44(uVar7,error),
                 CONCAT44(uVar8,function_name._4_4_),pixels);
      function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
      gl = (Functions *)0x2b5f673;
      goto LAB_00e52751;
    }
    if (format_local != 0x84f5) {
      if ((format_local == 0x8513) || (format_local - 0x8515 < 6)) {
        format_local = 0x8513;
        (**(code **)(lStack_48 + 0xb8))(0x8513,internal_format_local);
        dVar2 = (**(code **)(lStack_48 + 0x800))();
        glu::checkError(dVar2,"BindTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                        ,0x679);
        (**(code **)(lStack_48 + 0x1310))
                  (0x8516,level,type_local,width,height,0,error,CONCAT44(uVar7,function_name._4_4_),
                   pixels);
        (**(code **)(lStack_48 + 0x1310))
                  (0x8518,level,type_local,width,height,0,error,function_name._4_4_,pixels);
        (**(code **)(lStack_48 + 0x1310))
                  (0x851a,level,type_local,width,height,0,error,function_name._4_4_,pixels);
        (**(code **)(lStack_48 + 0x1310))
                  (0x8515,level,type_local,width,height,0,error,function_name._4_4_,pixels);
        (**(code **)(lStack_48 + 0x1310))
                  (0x8517,level,type_local,width,height,0,error,function_name._4_4_,pixels);
        (**(code **)(lStack_48 + 0x1310))
                  (0x8519,level,type_local,width,height,0,error,function_name._4_4_,pixels);
        function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
        gl = (Functions *)0x2b5eb14;
        goto LAB_00e52751;
      }
      if (format_local != 0x8c18) {
        if (format_local != 0x8c1a) {
          if (format_local == 0x8c2a) {
            (**(code **)(lStack_48 + 0x6c8))(1,out_buf_id);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"GenBuffers",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x654);
            (**(code **)(lStack_48 + 0x40))(0x8c2a,*out_buf_id);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"BindBuffer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x657);
            data._4_4_ = 0x10;
            local_58 = (GLvoid *)0x0;
            if (pixels != (GLvoid *)0x0) {
              data._4_4_ = width;
              local_58 = pixels;
            }
            (**(code **)(lStack_48 + 0x150))(0x8c2a,(long)(int)data._4_4_,local_58,0x88ea);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"BufferData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x664);
            (**(code **)(lStack_48 + 0xb8))(0x8c2a,internal_format_local);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"BindTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x668);
            (**(code **)(lStack_48 + 0x12f8))(0x8c2a,type_local,*out_buf_id);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"TexBuffer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x66b);
            goto LAB_00e52751;
          }
          if (format_local == 0x8d41) {
            (**(code **)(lStack_48 + 0xa0))(0x8d41,internal_format_local);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"BindRenderbuffer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x60f);
            (**(code **)(lStack_48 + 0x1238))(format_local,type_local,width,height);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"RenderbufferStorage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x612);
            (**(code **)(lStack_48 + 0xa0))(format_local,0);
            dVar2 = (**(code **)(lStack_48 + 0x800))();
            glu::checkError(dVar2,"BindRenderbuffer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                            ,0x615);
            goto LAB_00e52751;
          }
          if (format_local != 0x9009) {
            if (format_local == 0x9100) {
              (**(code **)(lStack_48 + 0xb8))(0x9100,internal_format_local);
              dVar2 = (**(code **)(lStack_48 + 0x800))();
              glu::checkError(dVar2,"BindTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                              ,0x632);
              (**(code **)(lStack_48 + 0x1318))(format_local,1,type_local,width,height,0);
              function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
              gl = (Functions *)0x2c7c2c5;
            }
            else {
              if (format_local != 0x9102) {
                pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar4,"Invalid enum",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                           ,0x68d);
                __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              (**(code **)(lStack_48 + 0xb8))(0x9102,internal_format_local);
              dVar2 = (**(code **)(lStack_48 + 0x800))();
              glu::checkError(dVar2,"BindTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                              ,0x63c);
              (**(code **)(lStack_48 + 0x1328))(format_local,1,type_local,width,height,depth,0);
              function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
              gl = (Functions *)0x2c7c2dd;
            }
            goto LAB_00e52751;
          }
        }
        goto LAB_00e52340;
      }
    }
  }
  (**(code **)(lStack_48 + 0xb8))(format_local,internal_format_local);
  dVar2 = (**(code **)(lStack_48 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0x628);
  (**(code **)(lStack_48 + 0x1310))
            (format_local,level,type_local,width,height,0,error,CONCAT44(uVar7,function_name._4_4_),
             pixels);
  function_name._0_4_ = (**(code **)(lStack_48 + 0x800))();
  gl = (Functions *)0x2b5eb14;
LAB_00e52751:
  if ((int)function_name != 0) {
    this = deqp::Context::getTestContext(_target_local);
    this_00 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [8])0x2c66a7b);
    EVar6 = glu::getErrorStr((int)function_name);
    local_208 = EVar6.m_getName;
    local_200 = EVar6.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1f8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])". Function: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&gl);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x29be45a);
    EVar6 = glu::getTextureTargetStr(format_local);
    local_228 = EVar6.m_getName;
    local_220 = EVar6.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_218);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])". Format: ");
    EVar6 = glu::getInternalFormatParameterStr(type_local);
    local_248 = EVar6.m_getName;
    local_240 = EVar6.m_value;
    local_238.m_getName = local_248;
    local_238.m_value = local_240;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_238);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    local_250 = glu::getTextureFormatName(error);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_250);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    EVar6 = glu::getTypeStr(function_name._4_4_);
    local_260.m_getName = EVar6.m_getName;
    local_260.m_value = EVar6.m_value;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_260);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Failed to create texture",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
               ,0x698);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (format_local != 0x8d41) {
    (**(code **)(lStack_48 + 0xb8))(format_local,0);
    dVar2 = (**(code **)(lStack_48 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x69f);
  }
  return;
}

Assistant:

void Utils::prepareTexture(deqp::Context& context, GLuint name, GLenum target, GLenum internal_format, GLenum format,
						   GLenum type, GLuint level, GLuint width, GLuint height, GLuint depth, const GLvoid* pixels,
						   GLuint& out_buf_id)
{
	static const GLint   border		   = 0;
	GLenum				 error		   = 0;
	const GLchar*		 function_name = "unknown";
	const Functions&	 gl			   = context.getRenderContext().getFunctions();
	static const GLsizei samples	   = 1;

	/* Translate proxies into real targets */
	target = transProxyToRealTarget(target);

	/* Initialize */
	switch (target)
	{
	case GL_RENDERBUFFER:
		gl.bindRenderbuffer(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		gl.renderbufferStorage(target, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderbufferStorage");

		gl.bindRenderbuffer(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindRenderbuffer");

		break;

	case GL_TEXTURE_1D:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage1D(target, level, internal_format, width, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage1D";

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(target, level, internal_format, width, height, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2DMultisample(target, samples, internal_format, width, height, GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage2DMultisample";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3DMultisample(target, samples, internal_format, width, height, depth,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage3DMultisample";

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		gl.bindTexture(target, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage3D(target, level, internal_format, width, height, depth, border, format, type, pixels);
		error		  = gl.getError();
		function_name = "TexImage3D";

		break;

	case GL_TEXTURE_BUFFER:
		gl.genBuffers(1, &out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

		gl.bindBuffer(GL_TEXTURE_BUFFER, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		{
			GLsizei		  size = 16;
			const GLvoid* data = 0;

			if (0 != pixels)
			{
				size = width;
				data = pixels;
			}

			gl.bufferData(GL_TEXTURE_BUFFER, size, data, GL_DYNAMIC_COPY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");
		}

		gl.bindTexture(GL_TEXTURE_BUFFER, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texBuffer(GL_TEXTURE_BUFFER, internal_format, out_buf_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexBuffer");

		break;

	case GL_TEXTURE_CUBE_MAP:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
		/* Change target to CUBE_MAP, it will be used later to change base and max level */
		target = GL_TEXTURE_CUBE_MAP;
		gl.bindTexture(target, name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, level, internal_format, width, height, border, format, type,
					  pixels);
		gl.texImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, level, internal_format, width, height, border, format, type,
					  pixels);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	if (GL_NO_ERROR != error)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error: " << glu::getErrorStr(error) << ". Function: " << function_name
			<< ". Target: " << glu::getTextureTargetStr(target)
			<< ". Format: " << glu::getInternalFormatParameterStr(internal_format) << ", "
			<< glu::getTextureFormatName(format) << ", " << glu::getTypeStr(type) << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to create texture");
	}

	if (GL_RENDERBUFFER != target)
	{
		/* Clean binding point */
		gl.bindTexture(target, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
}